

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::backtrack(Solver *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  bool bVar5;
  Literal lastChoiceInverted;
  Literal local_3c;
  ImpliedLiteral local_38;
  
  local_3c.rep_ = 0;
  sVar4 = (this->levels_).super_type.ebo_.size;
  bVar5 = sVar4 != (this->levels_).root;
  if (bVar5) {
    do {
      local_3c.rep_ =
           *(uint *)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                    (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf + (sVar4 - 1)) << 2))
           & 0xfffffffe ^ 2;
      undoUntil(this,sVar4 - 1,2);
      if (-1 < *(int *)&(this->levels_).field_0x14) {
        uVar1 = (this->levels_).super_type.ebo_.size;
        uVar3 = (this->levels_).root;
        if (uVar3 < uVar1) {
          uVar3 = uVar1;
        }
        *(uint *)&(this->levels_).field_0x14 = uVar3 & 0x3fffffff | 0x40000000;
      }
      if ((this->conflict_).ebo_.size == 0) {
        local_38.lit.rep_ = 0;
        local_38.level = 0;
        bVar2 = force(this,&local_3c,(Antecedent *)&local_38);
        if (bVar2) {
          local_38.level = (this->levels_).super_type.ebo_.size;
          local_38.lit.rep_ = local_3c.rep_;
          local_38.ante.super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ = 0;
          local_38.ante.super_pair<Clasp::Antecedent,_unsigned_int>.second = 0xffffffff;
          if ((this->impliedLits_).level < local_38.level) {
            (this->impliedLits_).level = local_38.level;
          }
          bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::
          push_back(&(this->impliedLits_).lits,&local_38);
          return bVar5;
        }
      }
      sVar4 = (this->levels_).super_type.ebo_.size;
      bVar5 = sVar4 != (this->levels_).root;
    } while (bVar5);
  }
  setStopConflict(this);
  return bVar5;
}

Assistant:

bool Solver::backtrack() {
	Literal lastChoiceInverted;
	do {
		if (decisionLevel() == rootLevel()) {
			setStopConflict();
			return false;
		}
		lastChoiceInverted = ~decision(decisionLevel());
		undoUntil(decisionLevel() - 1, undo_pop_proj_level);
		setBacktrackLevel(decisionLevel(), undo_pop_bt_level);
	} while (hasConflict() || !force(lastChoiceInverted, 0));
	// remember flipped literal for copyGuidingPath()
	impliedLits_.add(decisionLevel(), ImpliedLiteral(lastChoiceInverted, decisionLevel(), 0));
	return true;
}